

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O1

shared_ptr<BER_CONTAINER> __thiscall
ComplexType::createObjectForType(ComplexType *this,ASN_TYPE valueType)

{
  NetworkAddress *__p;
  ulong uVar1;
  ComplexType *__p_00;
  IntegerType *__p_01;
  ImplicitNullType *__p_02;
  TimestampType *__p_03;
  Counter32 *__p_04;
  OpaqueType *__p_05;
  Counter64 *__p_06;
  Gauge *__p_07;
  OIDType *__p_08;
  NullType *__p_09;
  OctetType *__p_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  shared_ptr<BER_CONTAINER> sVar2;
  
  if (0x7f < (int)valueType) {
    uVar1 = (ulong)(valueType - NOSUCHINSTANCE);
    if (valueType - NOSUCHINSTANCE < 0x27) {
      if ((0x7780000000U >> (uVar1 & 0x3f) & 1) != 0) {
LAB_00105559:
        __p_00 = (ComplexType *)operator_new(0x28);
        (__p_00->super_BER_CONTAINER)._type = valueType;
        (__p_00->super_BER_CONTAINER)._length = 0;
        (__p_00->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__ComplexType_00114f30
        ;
        (__p_00->values).
        super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__p_00->values).
        super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__p_00->values).
        super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)__p_00;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ComplexType*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_BER_CONTAINER)._type,
                   __p_00);
        in_RDX._M_pi = extraout_RDX_00;
        goto LAB_0010589b;
      }
      if (uVar1 == 0) {
        __p_02 = (ImplicitNullType *)operator_new(0x10);
        (__p_02->super_NullType).super_BER_CONTAINER._vptr_BER_CONTAINER =
             (_func_int **)&PTR__BER_CONTAINER_00114f80;
        (__p_02->super_NullType).super_BER_CONTAINER._type = NOSUCHINSTANCE;
        (__p_02->super_NullType).super_BER_CONTAINER._length = 0;
      }
      else {
        if (uVar1 != 1) goto LAB_00105629;
        __p_02 = (ImplicitNullType *)operator_new(0x10);
        (__p_02->super_NullType).super_BER_CONTAINER._vptr_BER_CONTAINER =
             (_func_int **)&PTR__BER_CONTAINER_00114f80;
        (__p_02->super_NullType).super_BER_CONTAINER._type = ENDOFMIBVIEW;
        (__p_02->super_NullType).super_BER_CONTAINER._length = 0;
      }
    }
    else {
LAB_00105629:
      if (valueType != NOSUCHOBJECT) goto switchD_001054e8_caseD_45;
      __p_02 = (ImplicitNullType *)operator_new(0x10);
      (__p_02->super_NullType).super_BER_CONTAINER._vptr_BER_CONTAINER =
           (_func_int **)&PTR__BER_CONTAINER_00114f80;
      (__p_02->super_NullType).super_BER_CONTAINER._type = NOSUCHOBJECT;
      (__p_02->super_NullType).super_BER_CONTAINER._length = 0;
    }
    (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)__p_02;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ImplicitNullType*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_BER_CONTAINER)._type,
               __p_02);
    in_RDX._M_pi = extraout_RDX_10;
    goto LAB_0010589b;
  }
  switch(valueType) {
  case NETWORK_ADDRESS:
    __p = (NetworkAddress *)operator_new(0x20);
    (__p->super_BER_CONTAINER)._type = NETWORK_ADDRESS;
    (__p->super_BER_CONTAINER)._length = 0;
    (__p->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__NetworkAddress_00115528;
    (__p->_value)._vptr_IPAddress = (_func_int **)&PTR__IPAddress_00114e80;
    (__p->_value)._address = INADDR_NONE._address;
    (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)__p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<NetworkAddress*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_BER_CONTAINER)._type,__p)
    ;
    in_RDX._M_pi = extraout_RDX;
    break;
  case COUNTER32:
    __p_04 = (Counter32 *)operator_new(0x18);
    (__p_04->super_IntegerType)._value = 0;
    (__p_04->super_IntegerType).super_BER_CONTAINER._vptr_BER_CONTAINER =
         (_func_int **)&PTR__BER_CONTAINER_00115020;
    (__p_04->super_IntegerType).super_BER_CONTAINER._type = COUNTER32;
    (__p_04->super_IntegerType).super_BER_CONTAINER._length = 0;
    (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)__p_04;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Counter32*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_BER_CONTAINER)._type,
               __p_04);
    in_RDX._M_pi = extraout_RDX_03;
    break;
  case GAUGE32:
    __p_07 = (Gauge *)operator_new(0x18);
    (__p_07->super_IntegerType)._value = 0;
    (__p_07->super_IntegerType).super_BER_CONTAINER._vptr_BER_CONTAINER =
         (_func_int **)&PTR__BER_CONTAINER_00115070;
    (__p_07->super_IntegerType).super_BER_CONTAINER._type = GAUGE32;
    (__p_07->super_IntegerType).super_BER_CONTAINER._length = 0;
    (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)__p_07;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Gauge*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_BER_CONTAINER)._type,
               __p_07);
    in_RDX._M_pi = extraout_RDX_06;
    break;
  case TIMESTAMP:
    __p_03 = (TimestampType *)operator_new(0x18);
    (__p_03->super_IntegerType)._value = 0;
    (__p_03->super_IntegerType).super_BER_CONTAINER._vptr_BER_CONTAINER =
         (_func_int **)&PTR__BER_CONTAINER_00114fd0;
    (__p_03->super_IntegerType).super_BER_CONTAINER._type = TIMESTAMP;
    (__p_03->super_IntegerType).super_BER_CONTAINER._length = 0;
    (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)__p_03;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<TimestampType*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_BER_CONTAINER)._type,
               __p_03);
    in_RDX._M_pi = extraout_RDX_02;
    break;
  case OPAQUE:
    __p_05 = (OpaqueType *)operator_new(0x20);
    (__p_05->super_BER_CONTAINER)._type = OPAQUE;
    (__p_05->super_BER_CONTAINER)._length = 0;
    (__p_05->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__OpaqueType_00115618;
    __p_05->_value = (uint8_t *)0x0;
    __p_05->_dataLength = 0;
    (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)__p_05;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<OpaqueType*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_BER_CONTAINER)._type,
               __p_05);
    in_RDX._M_pi = extraout_RDX_04;
    break;
  case 0x45:
    goto switchD_001054e8_caseD_45;
  case COUNTER64:
    __p_06 = (Counter64 *)operator_new(0x18);
    (__p_06->super_BER_CONTAINER)._type = COUNTER64;
    (__p_06->super_BER_CONTAINER)._length = 0;
    (__p_06->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__BER_CONTAINER_00115708;
    __p_06->_value = 0;
    (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)__p_06;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Counter64*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_BER_CONTAINER)._type,
               __p_06);
    in_RDX._M_pi = extraout_RDX_05;
    break;
  default:
    switch(valueType) {
    case INTEGER:
      __p_01 = (IntegerType *)operator_new(0x18);
      (__p_01->super_BER_CONTAINER)._type = INTEGER;
      (__p_01->super_BER_CONTAINER)._length = 0;
      (__p_01->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__BER_CONTAINER_00115578
      ;
      __p_01->_value = 0;
      (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)__p_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<IntegerType*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_BER_CONTAINER)._type,
                 __p_01);
      in_RDX._M_pi = extraout_RDX_01;
      break;
    case STRING:
      __p_10 = (OctetType *)operator_new(0x30);
      (__p_10->super_BER_CONTAINER)._type = STRING;
      (__p_10->super_BER_CONTAINER)._length = 0;
      (__p_10->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__OctetType_001155c8;
      (__p_10->_value)._M_dataplus._M_p = (pointer)&(__p_10->_value).field_2;
      (__p_10->_value)._M_string_length = 0;
      (__p_10->_value).field_2._M_local_buf[0] = '\0';
      (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)__p_10;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<OctetType*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_BER_CONTAINER)._type,
                 __p_10);
      in_RDX._M_pi = extraout_RDX_09;
      break;
    case NULLTYPE:
      __p_09 = (NullType *)operator_new(0x10);
      (__p_09->super_BER_CONTAINER)._type = NULLTYPE;
      (__p_09->super_BER_CONTAINER)._length = 0;
      (__p_09->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__BER_CONTAINER_001156b8
      ;
      (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)__p_09;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<NullType*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_BER_CONTAINER)._type,
                 __p_09);
      in_RDX._M_pi = extraout_RDX_08;
      break;
    case OID:
      __p_08 = (OIDType *)operator_new(0x50);
      (__p_08->super_BER_CONTAINER)._type = OID;
      (__p_08->super_BER_CONTAINER)._length = 0;
      (__p_08->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__OIDType_00115668;
      __p_08->valid = false;
      (__p_08->_value)._M_dataplus._M_p = (pointer)&(__p_08->_value).field_2;
      (__p_08->_value)._M_string_length = 0;
      (__p_08->_value).field_2._M_local_buf[0] = '\0';
      (__p_08->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__p_08->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p_08->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)__p_08;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<OIDType*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_BER_CONTAINER)._type,
                 __p_08);
      in_RDX._M_pi = extraout_RDX_07;
      break;
    default:
      if (valueType == STRUCTURE) goto LAB_00105559;
    case 3:
switchD_001054e8_caseD_45:
      (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)0x0;
      (this->super_BER_CONTAINER)._type = 0;
      (this->super_BER_CONTAINER)._length = 0;
    }
  }
LAB_0010589b:
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_BER_CONTAINER;
  return (shared_ptr<BER_CONTAINER>)
         sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> ComplexType::createObjectForType(ASN_TYPE valueType){
    SNMP_LOGD("Creating object of type: %d\n", valueType);
    switch(valueType){
        case INTEGER:
            return std::shared_ptr<BER_CONTAINER>(new IntegerType());
        case STRING:
            return std::shared_ptr<BER_CONTAINER>(new OctetType());
        case OID: 
            return std::shared_ptr<BER_CONTAINER>(new OIDType());
        case NULLTYPE:
            return std::shared_ptr<BER_CONTAINER>(new NullType());

        case NOSUCHOBJECT:
            return std::shared_ptr<BER_CONTAINER>(new ImplicitNullType(NOSUCHOBJECT));
        case NOSUCHINSTANCE:
            return std::shared_ptr<BER_CONTAINER>(new ImplicitNullType(NOSUCHINSTANCE));
        case ENDOFMIBVIEW:
            return std::shared_ptr<BER_CONTAINER>(new ImplicitNullType(ENDOFMIBVIEW));

        // devired
        case NETWORK_ADDRESS:
            return std::shared_ptr<BER_CONTAINER>(new NetworkAddress());
        case TIMESTAMP:
            return std::shared_ptr<BER_CONTAINER>(new TimestampType());
        case COUNTER32:
            return std::shared_ptr<BER_CONTAINER>(new Counter32());
        case GAUGE32:
            return std::shared_ptr<BER_CONTAINER>(new Gauge());
        case COUNTER64:
            return std::shared_ptr<BER_CONTAINER>(new Counter64());
        case OPAQUE:
            return std::shared_ptr<BER_CONTAINER>(new OpaqueType());

        // Complex
        /* OPAQUE = 0x44 */
        case STRUCTURE:

        case GetRequestPDU:
        case GetNextRequestPDU:
        case GetResponsePDU:
        case SetRequestPDU:
        case GetBulkRequestPDU:

        //case TrapPDU: // should never get v1trap, but put it in anyway
        case InformRequestPDU:
        case Trapv2PDU:
            return std::shared_ptr<BER_CONTAINER>(new ComplexType(valueType));
        default:
            return nullptr;
    }
}